

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QtPrivate::QEqualityOperatorForType<QDBusPendingReply<QDBusVariant>,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QVariant local_b0;
  QVariant local_90;
  QVariant local_70;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusPendingReplyBase::argumentAt((int)&local_50);
  qdbus_cast<QDBusVariant>((QDBusVariant *)&local_90,&local_50);
  QVariant::~QVariant(&local_50);
  QDBusPendingReplyBase::argumentAt((int)&local_50);
  qdbus_cast<QDBusVariant>((QDBusVariant *)&local_b0,&local_50);
  QVariant::~QVariant(&local_50);
  QVariant::QVariant(&local_50,&local_90);
  QVariant::QVariant(&local_70,&local_b0);
  uVar1 = QVariant::equals(&local_50);
  QVariant::~QVariant(&local_70);
  QVariant::~QVariant(&local_50);
  QVariant::~QVariant(&local_b0);
  QVariant::~QVariant(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool equals(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) == *reinterpret_cast<const T *>(b); }